

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void av1_calc_proj_params_high_bd_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  undefined4 in_stack_00000038;
  int in_stack_000000bc;
  uint8_t *in_stack_000000c0;
  int in_stack_000000cc;
  int in_stack_000000d0;
  int in_stack_000000d4;
  uint8_t *in_stack_000000d8;
  int in_stack_0000019c;
  uint8_t *in_stack_000001a0;
  int in_stack_000001ac;
  int in_stack_000001b0;
  int in_stack_000001b4;
  uint8_t *in_stack_000001b8;
  int32_t *in_stack_000003e0;
  int in_stack_000003e8;
  int64_t (*in_stack_000003f0) [2];
  int64_t *in_stack_000003f8;
  int32_t *in_stack_000007c0;
  int in_stack_000007c8;
  int32_t *in_stack_000007d0;
  int in_stack_000007d8;
  int64_t (*in_stack_000007e0) [2];
  int64_t *in_stack_000007e8;
  
  if ((*(int *)CONCAT44(dat_stride,in_stack_00000038) < 1) ||
     (*(int *)(CONCAT44(dat_stride,in_stack_00000038) + 4) < 1)) {
    if (*(int *)CONCAT44(dat_stride,in_stack_00000038) < 1) {
      if (0 < *(int *)(CONCAT44(dat_stride,in_stack_00000038) + 4)) {
        calc_proj_params_r1_high_bd_sse4_1
                  (in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,
                   in_stack_000000c0,in_stack_000000bc,in_stack_000003e0,in_stack_000003e8,
                   in_stack_000003f0,in_stack_000003f8);
      }
    }
    else {
      calc_proj_params_r0_high_bd_sse4_1
                (in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc,
                 in_stack_000000c0,in_stack_000000bc,in_stack_000003e0,in_stack_000003e8,
                 in_stack_000003f0,in_stack_000003f8);
    }
  }
  else {
    calc_proj_params_r0_r1_high_bd_sse4_1
              (in_stack_000001b8,in_stack_000001b4,in_stack_000001b0,in_stack_000001ac,
               in_stack_000001a0,in_stack_0000019c,in_stack_000007c0,in_stack_000007c8,
               in_stack_000007d0,in_stack_000007d8,in_stack_000007e0,in_stack_000007e8);
  }
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_sse4_1(const uint8_t *src8, int width,
                                         int height, int src_stride,
                                         const uint8_t *dat8, int dat_stride,
                                         int32_t *flt0, int flt0_stride,
                                         int32_t *flt1, int flt1_stride,
                                         int64_t H[2][2], int64_t C[2],
                                         const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                          dat_stride, flt0, flt0_stride, flt1,
                                          flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                       dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                       dat_stride, flt1, flt1_stride, H, C);
  }
}